

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<double,_2UL>_> *value)

{
  bool bVar1;
  double2 v;
  array<double,_2UL> local_20;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<double,2ul>(this,&local_20);
    if (bVar1) {
      *(double *)&value->contained = local_20._M_elems[0];
      *(double *)((long)&value->contained + 8) = local_20._M_elems[1];
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::double2> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::double2 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}